

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O2

int __thiscall
Imf_3_2::DwaCompressor::LossyDctDecoderBase::unRleAc
          (LossyDctDecoderBase *this,unsigned_short **currAcComp,unsigned_short *packedAcEnd,
          unsigned_short *halfZigBlock)

{
  ushort uVar1;
  int iVar2;
  InputExc *this_00;
  int iVar3;
  ushort *puVar4;
  int iVar5;
  int iVar6;
  
  puVar4 = *currAcComp;
  iVar5 = this->_packedAcCount;
  iVar2 = 0;
  iVar6 = 1;
  while( true ) {
    iVar5 = iVar5 + 1;
    if (0x3f < iVar6) {
      return iVar2;
    }
    if (packedAcEnd <= puVar4) break;
    uVar1 = *puVar4;
    if (uVar1 == 0xff00) {
      iVar3 = 0x40;
    }
    else if ((~uVar1 & 0xff00) == 0) {
      iVar3 = (uint)(byte)uVar1 + iVar6;
    }
    else {
      halfZigBlock[iVar6] = uVar1;
      iVar3 = iVar6 + 1;
      iVar2 = iVar6;
    }
    this->_packedAcCount = iVar5;
    puVar4 = puVar4 + 1;
    *currAcComp = puVar4;
    iVar6 = iVar3;
  }
  this_00 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::InputExc::InputExc(this_00,"Error uncompressing DWA data (packed AC buffer too small).");
  __cxa_throw(this_00,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
}

Assistant:

int
DwaCompressor::LossyDctDecoderBase::unRleAc (
    unsigned short*& currAcComp,
    unsigned short*  packedAcEnd,
    unsigned short*  halfZigBlock)
{
    //
    // Un-RLE the RLE'd blocks. If we find an item whose
    // high byte is 0xff, then insert the number of 0's
    // as indicated by the low byte.
    //
    // Otherwise, just copy the number verbatim.
    //

    int lastNonZero = 0;
    int dctComp     = 1;

    //
    // Start with a zero'ed block, so we don't have to
    // write when we hit a run symbol
    //

    while (dctComp < 64)
    {
        if (currAcComp >= packedAcEnd)
        {
            throw IEX_NAMESPACE::InputExc ("Error uncompressing DWA data"
                                           " (packed AC buffer too small).");
        }
        if (*currAcComp == 0xff00)
        {
            //
            // End of block
            //

            dctComp = 64;
        }
        else if ((*currAcComp) >> 8 == 0xff)
        {
            //
            // Run detected! Insert 0's.
            //
            // Since the block has been zeroed, just advance the ptr
            //

            dctComp += (*currAcComp) & 0xff;
        }
        else
        {
            //
            // Not a run, just copy over the value
            //

            lastNonZero           = dctComp;
            halfZigBlock[dctComp] = *currAcComp;

            dctComp++;
        }

        _packedAcCount++;
        currAcComp++;
    }

    return lastNonZero;
}